

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_compareDimensionallyNonEquivalentUnitsWhichHaveSameBase_Test::TestBody
          (Units_compareDimensionallyNonEquivalentUnitsWhichHaveSameBase_Test *this)

{
  string *psVar1;
  byte bVar2;
  char cVar3;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  long *local_88;
  AssertionResult local_80;
  long local_70 [2];
  AssertHelper local_60 [8];
  byte local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long local_38 [2];
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Units::create();
  psVar1 = local_28;
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"milli","");
  local_48 = (string *)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  libcellml::Units::addUnit((StandardUnit)local_28,(string *)0x10,1.0,1.0,(string *)&local_80);
  if (local_48 != (string *)local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_48;
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  psVar1 = local_48;
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  libcellml::Units::addUnit((StandardUnit)psVar1,0x10,1.0,1.0,(string *)0x0);
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  bVar2 = libcellml::Units::equivalent((shared_ptr *)&local_28,(shared_ptr *)&local_48);
  local_58[0] = bVar2 ^ 1;
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)local_58,"libcellml::Units::equivalent(u1, u2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x5f0,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_88 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
      local_88 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = libcellml::Units::equivalent((shared_ptr *)&local_48,(shared_ptr *)&local_28);
  local_58[0] = bVar2 ^ 1;
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)local_58,"libcellml::Units::equivalent(u2, u1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x5f1,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_88 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
      local_88 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, compareDimensionallyNonEquivalentUnitsWhichHaveSameBase)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::LUX, "milli");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::LUX, 0, 1.0, 1.0);

    EXPECT_FALSE(libcellml::Units::equivalent(u1, u2));
    EXPECT_FALSE(libcellml::Units::equivalent(u2, u1));
}